

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void json::Json::nextValue(Array *array,Node *VS)

{
  Nodes *this;
  string *__lhs;
  int iVar1;
  bool v;
  const_reference pvVar2;
  JsonError *pJVar3;
  allocator<char> local_1f1;
  int64_t i;
  stringstream s;
  
  this = &(VS->production).nodes;
  pvVar2 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(this,0);
  pvVar2 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at
                     (&(pvVar2->production).nodes,0);
  __lhs = &(pvVar2->token).value;
  std::__cxx11::stringstream::stringstream((stringstream *)&s,(string *)__lhs,_S_out|_S_in);
  if (pvVar2->isProduction_ == true) {
    iVar1 = (pvVar2->production).nonTerminal;
    if (iVar1 == 3) {
      createArray((Array *)&i,pvVar2);
      Array::add<json::Array,json::Array>(array,(Array *)&i);
      Array::~Array((Array *)&i);
    }
    else {
      if (iVar1 != 2) {
        pJVar3 = (JsonError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>((string *)&i,"invalid format",&local_1f1)
        ;
        JsonError::JsonError(pJVar3,(string *)&i);
        __cxa_throw(pJVar3,&JsonError::typeinfo,std::runtime_error::~runtime_error);
      }
      createObject((Object *)&i,pvVar2);
      Array::add<json::Object,json::Object>(array,(Object *)&i);
      Object::~Object((Object *)&i);
    }
  }
  else {
    switch((pvVar2->token).tokenId) {
    case 6:
      i = 0;
      std::istream::_M_extract<long>((long *)&s);
      Array::operator()(array,i);
      break;
    case 7:
      i = 0;
      std::istream::_M_extract<double>((double *)&s);
      Array::operator()(array,(double)i);
      break;
    case 8:
      Array::add<json::String,std::__cxx11::string>(array,__lhs);
      break;
    case 9:
      v = std::operator==(__lhs,"true");
      Array::operator()(array,v);
      break;
    default:
      pJVar3 = (JsonError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>((string *)&i,"invalid format",&local_1f1);
      JsonError::JsonError(pJVar3,(string *)&i);
      __cxa_throw(pJVar3,&JsonError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (1 < (ulong)(((long)(VS->production).nodes.
                         super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(VS->production).nodes.
                        super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x60)) {
    pvVar2 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(this,2);
    nextValue(array,pvVar2);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return;
}

Assistant:

static void nextValue(Array& array, parser::Node const& VS) {
            parser::Node const& V = VS.getProduction().nodes.at(0);

            parser::Node const& uv = V.getProduction().nodes.at(0);

            std::stringstream s(uv.getToken().value);

            if (uv.isProduction()) {
                if (uv.getProduction().nonTerminal == rules::Object) {
                    array(createObject(uv));
                } else if (uv.getProduction().nonTerminal == rules::Array) {
                    array(createArray(uv));
                } else {
                    throw JsonError("invalid format");
                }
            } else {
                if (uv.getToken().tokenId == rules::Integer) {
                    int64_t i = 0;
                    s >> i;
                    array(i);
                } else if (uv.getToken().tokenId == rules::String) {
                    array(uv.getToken().value);
                } else if (uv.getToken().tokenId == rules::Float) {
                    double d = 0;
                    s >> d;
                    array(d);
                } else if (uv.getToken().tokenId == rules::Bool) {
                    array(uv.getToken().value == "true");
                } else {
                    throw JsonError("invalid format");
                }
            }

            if (VS.getProduction().nodes.size() > 1) {
                parser::Node const& nextVS = VS.getProduction().nodes.at(2);
                nextValue(array, nextVS);
            }
        }